

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

string * __thiscall
units::to_string_abi_cxx11_
          (string *__return_storage_ptr__,units *this,precise_unit *un,uint64_t match_flags)

{
  precise_unit un_00;
  string sStack_38;
  
  un_00._8_8_ = un;
  un_00.multiplier_ = *(double *)this;
  to_string_internal_abi_cxx11_(&sStack_38,*(units **)(this + 8),un_00,match_flags);
  clean_unit_string(__return_storage_ptr__,&sStack_38,*(uint32_t *)(this + 0xc));
  std::__cxx11::string::~string((string *)&sStack_38);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const precise_unit& un, std::uint64_t match_flags)
{
    return clean_unit_string(
        to_string_internal(un, match_flags), un.commodity());
}